

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

void append_entry(char **p,char *prefix,wchar_t type,wchar_t tag,wchar_t flags,char *name,
                 wchar_t perm,wchar_t id)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  wchar_t local_3c;
  
  local_3c = id;
  if (prefix != (char *)0x0) {
    strcpy(*p,prefix);
    pcVar3 = *p;
    sVar2 = strlen(pcVar3);
    *p = pcVar3 + sVar2;
  }
  switch(tag) {
  case L'✑':
    pcVar3 = *p;
LAB_003d5a6a:
    builtin_strncpy(pcVar3,"user",5);
    break;
  case L'✒':
    pcVar3 = *p;
    if ((type & 0x3c00U) == 0) {
      name = (char *)0x0;
      local_3c = L'\xffffffff';
      goto LAB_003d5a6a;
    }
    builtin_strncpy(pcVar3,"owner@",7);
LAB_003d5a24:
    local_3c = L'\xffffffff';
    name = (char *)0x0;
    break;
  case L'✓':
    pcVar3 = *p;
    goto LAB_003d5a52;
  case L'✔':
    pcVar3 = *p;
    if ((type & 0x3c00U) != 0) {
      builtin_strncpy(pcVar3,"group@",7);
      goto LAB_003d5a24;
    }
    name = (char *)0x0;
    local_3c = L'\xffffffff';
LAB_003d5a52:
    builtin_strncpy(pcVar3,"group",6);
    break;
  case L'✕':
    builtin_strncpy(*p,"mask",5);
    goto LAB_003d5a3f;
  case L'✖':
    builtin_strncpy(*p,"other",6);
    goto LAB_003d5a3f;
  default:
    if (tag != L'❻') break;
    builtin_strncpy(*p,"everyone@",10);
LAB_003d5a3f:
    name = (char *)0x0;
    local_3c = L'\xffffffff';
  }
  pcVar3 = *p;
  sVar2 = strlen(pcVar3);
  pcVar3 = pcVar3 + sVar2;
  *p = pcVar3 + 1;
  *pcVar3 = ':';
  if (((type & 0x300U) != 0) || ((tag | 2U) == 0x2713)) {
    if (name == (char *)0x0) {
      if ((tag | 2U) == 0x2713) {
        append_id(p,local_3c);
        local_3c = local_3c | -(uint)((type & 0x3c00U) == 0);
      }
    }
    else {
      strcpy(*p,name);
      pcVar3 = *p;
      sVar2 = strlen(pcVar3);
      *p = pcVar3 + sVar2;
    }
    if ((0xfffffffdU < (uint)(tag + L'\xffffd8e9') & (byte)((uint)(flags & 4U) >> 2)) == 0) {
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = ':';
    }
    if ((type & 0x300U) != 0) {
      cVar5 = '-';
      cVar1 = 'r';
      if ((perm & 0x124U) == 0) {
        cVar1 = cVar5;
      }
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = cVar1;
      cVar1 = 'w';
      if ((perm & 0x92U) == 0) {
        cVar1 = cVar5;
      }
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = cVar1;
      cVar1 = 'x';
      if ((perm & 0x49U) == 0) {
        cVar1 = cVar5;
      }
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = cVar1;
      goto LAB_003d5c82;
    }
  }
  for (lVar4 = 4; lVar4 != 0xac; lVar4 = lVar4 + 0xc) {
    if ((*(uint *)(&UNK_004ea7fc + lVar4) & perm) == 0) {
      cVar5 = '-';
      if ((flags & 0x10U) == 0) goto LAB_003d5bae;
    }
    else {
      cVar5 = *(char *)((long)&nfsv4_acl_perm_map[0].perm + lVar4);
LAB_003d5bae:
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = cVar5;
    }
  }
  pcVar3 = *p;
  *p = pcVar3 + 1;
  *pcVar3 = ':';
  for (lVar4 = 4; lVar4 != 0x58; lVar4 = lVar4 + 0xc) {
    if ((*(uint *)(&UNK_004ea8ac + lVar4) & perm) == 0) {
      cVar5 = '-';
      if ((flags & 0x10U) == 0) goto LAB_003d5bf1;
    }
    else {
      cVar5 = *(char *)((long)&nfsv4_acl_flag_map[0].perm + lVar4);
LAB_003d5bf1:
      pcVar3 = *p;
      *p = pcVar3 + 1;
      *pcVar3 = cVar5;
    }
  }
  pcVar3 = *p;
  *p = pcVar3 + 1;
  *pcVar3 = ':';
  switch(type << 0x16 | (uint)(type + L'\xfffffc00') >> 10) {
  case L'\0':
    builtin_strncpy(*p,"allow",6);
    break;
  case L'\x01':
    builtin_strncpy(*p,"deny",5);
    break;
  case L'\x03':
    builtin_strncpy(*p,"audit",6);
    break;
  case L'\a':
    builtin_strncpy(*p,"alarm",6);
  }
  pcVar3 = *p;
  sVar2 = strlen(pcVar3);
  *p = pcVar3 + sVar2;
LAB_003d5c82:
  if (local_3c != L'\xffffffff') {
    pcVar3 = *p;
    *p = pcVar3 + 1;
    *pcVar3 = ':';
    append_id(p,local_3c);
    return;
  }
  return;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int type,
    int tag, int flags, const char *name, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		strcpy(*p, "everyone@");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (name != NULL) {
			strcpy(*p, name);
			*p += strlen(*p);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id(p, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*p)++ = ':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*p)++ = (perm & 0444) ? 'r' : '-';
		*(*p)++ = (perm & 0222) ? 'w' : '-';
		*(*p)++ = (perm & 0111) ? 'x' : '-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*p)++ = nfsv4_acl_perm_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*p)++ = nfsv4_acl_flag_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			strcpy(*p, "allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			strcpy(*p, "deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			strcpy(*p, "audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			strcpy(*p, "alarm");
			break;
		}
		*p += strlen(*p);
	}
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
}